

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.cpp
# Opt level: O1

int __thiscall
CNet::GetWireInDirection
          (CNet *this,vector<CWire_*,_std::allocator<CWire_*>_> *pWireList,int iPos,int iDirection,
          int iMode,int iValue)

{
  pointer *pppCVar1;
  short sVar2;
  pointer ppCVar3;
  iterator iVar4;
  uint uVar5;
  pointer ppCVar6;
  CWire *pWire;
  CWire *local_38;
  
  if (iMode == 1) {
    ppCVar3 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppCVar6 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppCVar6 != ppCVar3; ppCVar6 = ppCVar6 + 1) {
      local_38 = *ppCVar6;
      if (((local_38->super_CObject).m_iState & iValue) != 0) {
        uVar5 = CWire::GetDirection(local_38);
        if ((uVar5 & 0xf) == 0) {
          __assert_fail("iWireDirection&(DIR_VERTICAL|DIR_HORIZONTAL)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                        ,0x588,"int CNet::GetWireInDirection(vector<CWire *> *, int, int, int, int)"
                       );
        }
        if (uVar5 == iDirection) {
          if (iDirection == 10) {
            sVar2 = local_38->m_pPointE->m_iX;
          }
          else {
            if (iDirection != 5) {
              __assert_fail("FALSE",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                            ,0x594,
                            "int CNet::GetWireInDirection(vector<CWire *> *, int, int, int, int)");
            }
            sVar2 = local_38->m_pPointE->m_iY;
          }
          if (sVar2 == iPos) {
            iVar4._M_current =
                 (pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<CWire*,std::allocator<CWire*>>::_M_realloc_insert<CWire*const&>
                        ((vector<CWire*,std::allocator<CWire*>> *)pWireList,iVar4,&local_38);
            }
            else {
              *iVar4._M_current = local_38;
              pppCVar1 = &(pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl
                          .super__Vector_impl_data._M_finish;
              *pppCVar1 = *pppCVar1 + 1;
            }
          }
        }
      }
    }
  }
  else if (iMode == 0) {
    ppCVar3 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppCVar6 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppCVar6 != ppCVar3; ppCVar6 = ppCVar6 + 1) {
      local_38 = *ppCVar6;
      if (((local_38->super_CObject).m_iProp & iValue) != 0) {
        uVar5 = CWire::GetDirection(local_38);
        if ((uVar5 & 0xf) == 0) {
          __assert_fail("iWireDirection&(DIR_VERTICAL|DIR_HORIZONTAL)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                        ,0x56d,"int CNet::GetWireInDirection(vector<CWire *> *, int, int, int, int)"
                       );
        }
        if (uVar5 == iDirection) {
          if (iDirection == 10) {
            sVar2 = local_38->m_pPointE->m_iX;
          }
          else {
            if (iDirection != 5) {
              __assert_fail("FALSE",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                            ,0x579,
                            "int CNet::GetWireInDirection(vector<CWire *> *, int, int, int, int)");
            }
            sVar2 = local_38->m_pPointE->m_iY;
          }
          if (sVar2 == iPos) {
            iVar4._M_current =
                 (pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<CWire*,std::allocator<CWire*>>::_M_realloc_insert<CWire*const&>
                        ((vector<CWire*,std::allocator<CWire*>> *)pWireList,iVar4,&local_38);
            }
            else {
              *iVar4._M_current = local_38;
              pppCVar1 = &(pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>)._M_impl
                          .super__Vector_impl_data._M_finish;
              *pppCVar1 = *pppCVar1 + 1;
            }
          }
        }
      }
    }
  }
  return (int)((ulong)((long)(pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pWireList->super__Vector_base<CWire_*,_std::allocator<CWire_*>_>).
                            _M_impl.super__Vector_impl_data._M_start) >> 3);
}

Assistant:

int CNet::GetWireInDirection(vector<CWire*>* pWireList, int iPos, int iDirection, int iMode, int iValue)
{

	switch(iMode) {
	case GET_MODE_PROP:
		for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
		{
			CWire*	pWire	=	*itr;
			if(pWire->GetProp()&iValue)
			{
				int	iWireDirection	=	pWire->GetDirection();

				assert(iWireDirection&(DIR_VERTICAL|DIR_HORIZONTAL));

				if(iWireDirection==iDirection)
				{
					switch(iDirection){
					case DIR_HORIZONTAL:
						if(pWire->m_pPointE->Y()==iPos)	pWireList->push_back(pWire);
						break;
					case DIR_VERTICAL:
						if(pWire->m_pPointE->X()==iPos)	pWireList->push_back(pWire);
						break;
					default:
						assert(FALSE);
						break;
					}
				}
			}
		}
		break;
	case GET_MODE_STATE:
		for(vector<CWire*>::iterator itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
		{
			CWire*	pWire	=	*itr;
			if(pWire->GetState()&iValue)
			{
				int	iWireDirection	=	pWire->GetDirection();

				assert(iWireDirection&(DIR_VERTICAL|DIR_HORIZONTAL));

				if(iWireDirection==iDirection)
				{
					switch(iDirection){
					case DIR_HORIZONTAL:
						if(pWire->m_pPointE->Y()==iPos)	pWireList->push_back(pWire);
						break;
					case DIR_VERTICAL:
						if(pWire->m_pPointE->X()==iPos)	pWireList->push_back(pWire);
						break;
					default:
						assert(FALSE);
						break;
					}
				}
			}
		}
		break;
	}

	return	pWireList->size();
}